

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::GridLocalPolynomial::getSubGraph<(TasGrid::RuleLocal::erule)4>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GridLocalPolynomial *this,
          vector<int,_std::allocator<int>_> *point)

{
  allocator<int> *this_00;
  value_type vVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference rVar5;
  bool local_139;
  value_type_conflict3 local_ec;
  int dim_1;
  _Bit_type local_e0;
  reference local_d8;
  int local_c8;
  int local_c4;
  int slot;
  int dim;
  vector<int,_std::allocator<int>_> monkey_tail;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> monkey_count;
  int max_kids;
  int max_1d_kids;
  vector<bool,_std::allocator<bool>_> used;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> p;
  vector<int,_std::allocator<int>_> *point_local;
  GridLocalPolynomial *this_local;
  vector<int,_std::allocator<int>_> *graph;
  
  p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _7_1_ = 0;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,
             (vector<int,_std::allocator<int>_> *)point);
  iVar2 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  max_kids._3_1_ = 0;
  ::std::allocator<bool>::allocator((allocator<bool> *)((long)&max_kids + 2));
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&max_1d_kids,(long)iVar2,
             (bool *)((long)&max_kids + 3),(allocator<bool> *)((long)&max_kids + 2));
  ::std::allocator<bool>::~allocator((allocator<bool> *)((long)&max_kids + 2));
  iVar2 = RuleLocal::getMaxNumKids<(TasGrid::RuleLocal::erule)4>();
  monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = iVar2 * (this->super_BaseCanonicalGrid).num_dimensions;
  monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  this_00 = (allocator<int> *)
            ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  ::std::allocator<int>::allocator(this_00);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a0,1,
             (value_type_conflict3 *)
             ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),this_00);
  ::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&slot);
  while( true ) {
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,0);
    if (monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ <= *pvVar4) break;
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)local_a0);
    if (*pvVar4 < monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_) {
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)local_a0);
      local_c4 = *pvVar4 / iVar2;
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)local_c4);
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&slot,pvVar4);
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)&slot);
      iVar3 = *pvVar4;
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)local_a0);
      iVar3 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)4>(iVar3,*pvVar4 % iVar2);
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)local_c4);
      *pvVar4 = iVar3;
      local_c8 = MultiIndexSet::getSlot
                           (&(this->super_BaseCanonicalGrid).points,
                            (vector<int,_std::allocator<int>_> *)local_40);
      local_139 = true;
      if (local_c8 != -1) {
        rVar5 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&max_1d_kids,(long)local_c8);
        local_d8 = rVar5;
        local_139 = ::std::_Bit_reference::operator_cast_to_bool(&local_d8);
      }
      if (local_139 == false) {
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,&local_c8);
        rVar5 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&max_1d_kids,(long)local_c8);
        _dim_1 = rVar5;
        ::std::_Bit_reference::operator=((_Bit_reference *)&dim_1,true);
        local_ec = 0;
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_a0,&local_ec);
      }
      else {
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                           ((vector<int,_std::allocator<int>_> *)&slot);
        vVar1 = *pvVar4;
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,(long)local_c4);
        *pvVar4 = vVar1;
        std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)&slot)
        ;
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                           ((vector<int,_std::allocator<int>_> *)local_a0);
        *pvVar4 = *pvVar4 + 1;
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)local_a0);
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)local_a0);
      iVar3 = *pvVar4;
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)&slot);
      vVar1 = *pvVar4;
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)(iVar3 / iVar2));
      *pvVar4 = vVar1;
      std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)&slot);
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)local_a0);
      *pvVar4 = *pvVar4 + 1;
    }
  }
  p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _7_1_ = 1;
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&slot);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  ::std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)&max_1d_kids);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  if ((p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GridLocalPolynomial::getSubGraph(std::vector<int> const &point) const{
    std::vector<int> graph, p = point;
    std::vector<bool> used(points.getNumIndexes(), false);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    int max_kids = max_1d_kids * num_dimensions;

    std::vector<int> monkey_count(1, 0), monkey_tail;

    while(monkey_count[0] < max_kids){
        if (monkey_count.back() < max_kids){
            int dim = monkey_count.back() / max_1d_kids;
            monkey_tail.push_back(p[dim]);
            p[dim] = RuleLocal::getKid<effrule>(monkey_tail.back(), monkey_count.back() % max_1d_kids);
            int slot = points.getSlot(p);
            if ((slot == -1) || used[slot]){ // this kid is missing
                p[dim] = monkey_tail.back();
                monkey_tail.pop_back();
                monkey_count.back()++;
            }else{ // found kid, go deeper in the graph
                graph.push_back(slot);
                used[slot] = true;
                monkey_count.push_back(0);
            }
        }else{
            monkey_count.pop_back();
            int dim = monkey_count.back() / max_1d_kids;
            p[dim] = monkey_tail.back();
            monkey_tail.pop_back();
            monkey_count.back()++;
        }
    }

    return graph;
}